

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

bool __thiscall
QDirListingPrivate::matchesLegacyFilters(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  QStringView fileName_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  QFlags<QDir::Filter> *this_00;
  qsizetype qVar4;
  long in_RDI;
  long in_FS_OFFSET;
  bool doReadable;
  bool doExecutable;
  bool doWritable;
  bool filterPermissions;
  bool skipFiles;
  bool skipDirs;
  bool includeHidden;
  bool includeSystem;
  bool skipSymlinks;
  qsizetype fileNameSize;
  bool dotOrDotDot;
  Filters *filters;
  QString *fileName;
  QFlags<QDir::Filter> perms;
  Filter in_stack_fffffffffffffecc;
  Filter in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed5;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  QDirEntryInfo *in_stack_fffffffffffffed8;
  QFlagsStorage<QDir::Filter> lhs;
  QFlags<QDir::Filter> *pQVar5;
  QStringView *in_stack_fffffffffffffee0;
  QString *in_stack_fffffffffffffee8;
  undefined5 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  storage_type_conflict *in_stack_fffffffffffffef8;
  bool local_61;
  QFlags<QDir::Filter> local_60;
  QFlags<QDir::Filter> local_5c;
  QFlags<QDir::Filter> local_58;
  CompareAgainstLiteralZero local_4d;
  QFlagsStorageHelper<QDir::Filter,_4> local_4c;
  Int local_48;
  QFlagsStorageHelper<QDir::Filter,_4> local_44;
  QFlagsStorageHelper<QDir::Filter,_4> local_40;
  QFlagsStorage<QDir::Filter> local_3c;
  QFlagsStorageHelper<QDir::Filter,_4> local_38;
  QFlagsStorageHelper<QDir::Filter,_4> local_34;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDirEntryInfo::fileName(in_stack_fffffffffffffed8);
  bVar1 = QString::isEmpty((QString *)0x2944fd);
  if (bVar1) {
    local_61 = false;
  }
  else {
    this_00 = (QFlags<QDir::Filter> *)(in_RDI + 300);
    QStringView::QStringView<QString,_true>
              (in_stack_fffffffffffffee0,(QString *)in_stack_fffffffffffffed8);
    fileName_00.m_size._5_1_ = in_stack_fffffffffffffef5;
    fileName_00.m_size._0_5_ = in_stack_fffffffffffffef0;
    fileName_00.m_size._6_1_ = in_stack_fffffffffffffef6;
    fileName_00.m_size._7_1_ = in_stack_fffffffffffffef7;
    fileName_00.m_data = in_stack_fffffffffffffef8;
    bVar2 = isDotOrDotDot(fileName_00);
    qVar4 = QString::size(&local_20);
    local_34.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)
                    CONCAT17(in_stack_fffffffffffffed7,
                             CONCAT16(in_stack_fffffffffffffed6,
                                      CONCAT15(in_stack_fffffffffffffed5,
                                               CONCAT14(in_stack_fffffffffffffed4,
                                                        in_stack_fffffffffffffed0)))),
                    in_stack_fffffffffffffecc);
    bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_34);
    bVar1 = false;
    if ((bVar3) && (bVar1 = false, bVar2)) {
      bVar1 = qVar4 == 1;
    }
    if (bVar1) {
      local_61 = false;
    }
    else {
      local_38.super_QFlagsStorage<QDir::Filter>.i =
           (QFlagsStorage<QDir::Filter>)
           QFlags<QDir::Filter>::operator&
                     ((QFlags<QDir::Filter> *)
                      CONCAT17(in_stack_fffffffffffffed7,
                               CONCAT16(in_stack_fffffffffffffed6,
                                        CONCAT15(in_stack_fffffffffffffed5,
                                                 CONCAT14(in_stack_fffffffffffffed4,
                                                          in_stack_fffffffffffffed0)))),
                      in_stack_fffffffffffffecc);
      bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_38);
      bVar1 = false;
      if ((bVar3) && (bVar1 = false, bVar2)) {
        bVar1 = qVar4 == 2;
      }
      if (bVar1) {
        local_61 = false;
      }
      else {
        QFlags<QDir::Filter>::QFlags
                  ((QFlags<QDir::Filter> *)
                   CONCAT17(in_stack_fffffffffffffed7,
                            CONCAT16(in_stack_fffffffffffffed6,
                                     CONCAT15(in_stack_fffffffffffffed5,
                                              CONCAT14(in_stack_fffffffffffffed4,
                                                       in_stack_fffffffffffffed0)))),
                   in_stack_fffffffffffffecc);
        bVar1 = QFlags<QDir::Filter>::testAnyFlags(this_00,(QFlags<QDir::Filter>)local_3c.i);
        if (((bVar1) &&
            (bVar1 = QDirEntryInfo::isDir
                               ((QDirEntryInfo *)
                                CONCAT17(in_stack_fffffffffffffed7,
                                         CONCAT16(in_stack_fffffffffffffed6,
                                                  CONCAT15(in_stack_fffffffffffffed5,
                                                           CONCAT14(in_stack_fffffffffffffed4,
                                                                    in_stack_fffffffffffffed0))))),
            bVar1)) ||
           (bVar1 = regexMatchesName((QDirListingPrivate *)
                                     CONCAT17(in_stack_fffffffffffffef7,
                                              CONCAT16(in_stack_fffffffffffffef6,
                                                       CONCAT15(in_stack_fffffffffffffef5,
                                                                in_stack_fffffffffffffef0))),
                                     in_stack_fffffffffffffee8), bVar1)) {
          bVar1 = QFlags<QDir::Filter>::testAnyFlag
                            ((QFlags<QDir::Filter> *)
                             CONCAT17(in_stack_fffffffffffffed7,
                                      CONCAT16(in_stack_fffffffffffffed6,
                                               CONCAT15(in_stack_fffffffffffffed5,
                                                        CONCAT14(in_stack_fffffffffffffed4,
                                                                 in_stack_fffffffffffffed0)))),
                             in_stack_fffffffffffffecc);
          bVar3 = QFlags<QDir::Filter>::testAnyFlag
                            ((QFlags<QDir::Filter> *)
                             CONCAT17(in_stack_fffffffffffffed7,
                                      CONCAT16(in_stack_fffffffffffffed6,
                                               CONCAT15(in_stack_fffffffffffffed5,
                                                        CONCAT14(in_stack_fffffffffffffed4,
                                                                 in_stack_fffffffffffffed0)))),
                             in_stack_fffffffffffffecc);
          if (((!bVar1) ||
              (bVar1 = QDirEntryInfo::isSymLink
                                 ((QDirEntryInfo *)
                                  CONCAT17(in_stack_fffffffffffffed7,
                                           CONCAT16(in_stack_fffffffffffffed6,
                                                    CONCAT15(in_stack_fffffffffffffed5,
                                                             CONCAT14(in_stack_fffffffffffffed4,
                                                                      in_stack_fffffffffffffed0)))))
              , !bVar1)) ||
             ((bVar3 && (bVar1 = QDirEntryInfo::exists
                                           ((QDirEntryInfo *)
                                            CONCAT17(in_stack_fffffffffffffed7,
                                                     CONCAT16(in_stack_fffffffffffffed6,
                                                              CONCAT15(in_stack_fffffffffffffed5,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffed4,
                                                  in_stack_fffffffffffffed0))))), !bVar1)))) {
            bVar1 = QFlags<QDir::Filter>::testAnyFlag
                              ((QFlags<QDir::Filter> *)
                               CONCAT17(in_stack_fffffffffffffed7,
                                        CONCAT16(in_stack_fffffffffffffed6,
                                                 CONCAT15(in_stack_fffffffffffffed5,
                                                          CONCAT14(in_stack_fffffffffffffed4,
                                                                   in_stack_fffffffffffffed0)))),
                               in_stack_fffffffffffffecc);
            if (((bVar1) || (bVar2)) ||
               (bVar1 = QDirEntryInfo::isHidden
                                  ((QDirEntryInfo *)
                                   CONCAT17(in_stack_fffffffffffffed7,
                                            CONCAT16(in_stack_fffffffffffffed6,
                                                     CONCAT15(in_stack_fffffffffffffed5,
                                                              CONCAT14(in_stack_fffffffffffffed4,
                                                                       in_stack_fffffffffffffed0))))
                                  ), !bVar1)) {
              if (!bVar3) {
                bVar1 = QDirEntryInfo::isFile
                                  ((QDirEntryInfo *)
                                   CONCAT17(in_stack_fffffffffffffed7,
                                            CONCAT16(in_stack_fffffffffffffed6,
                                                     CONCAT15(in_stack_fffffffffffffed5,
                                                              CONCAT14(in_stack_fffffffffffffed4,
                                                                       in_stack_fffffffffffffed0))))
                                  );
                if (((!bVar1) &&
                    (bVar1 = QDirEntryInfo::isDir
                                       ((QDirEntryInfo *)
                                        CONCAT17(in_stack_fffffffffffffed7,
                                                 CONCAT16(in_stack_fffffffffffffed6,
                                                          CONCAT15(in_stack_fffffffffffffed5,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffed4,
                                                  in_stack_fffffffffffffed0))))), !bVar1)) &&
                   (bVar1 = QDirEntryInfo::isSymLink
                                      ((QDirEntryInfo *)
                                       CONCAT17(in_stack_fffffffffffffed7,
                                                CONCAT16(in_stack_fffffffffffffed6,
                                                         CONCAT15(in_stack_fffffffffffffed5,
                                                                  CONCAT14(in_stack_fffffffffffffed4
                                                                           ,
                                                  in_stack_fffffffffffffed0))))), !bVar1)) {
                  local_61 = false;
                  goto LAB_00294bee;
                }
                bVar1 = QDirEntryInfo::isSymLink
                                  ((QDirEntryInfo *)
                                   CONCAT17(in_stack_fffffffffffffed7,
                                            CONCAT16(in_stack_fffffffffffffed6,
                                                     CONCAT15(in_stack_fffffffffffffed5,
                                                              CONCAT14(in_stack_fffffffffffffed4,
                                                                       in_stack_fffffffffffffed0))))
                                  );
                if ((bVar1) &&
                   (bVar1 = QDirEntryInfo::exists
                                      ((QDirEntryInfo *)
                                       CONCAT17(in_stack_fffffffffffffed7,
                                                CONCAT16(in_stack_fffffffffffffed6,
                                                         CONCAT15(in_stack_fffffffffffffed5,
                                                                  CONCAT14(in_stack_fffffffffffffed4
                                                                           ,
                                                  in_stack_fffffffffffffed0))))), !bVar1)) {
                  local_61 = false;
                  goto LAB_00294bee;
                }
              }
              ::operator|(CONCAT13(in_stack_fffffffffffffed7,
                                   CONCAT12(in_stack_fffffffffffffed6,
                                            CONCAT11(in_stack_fffffffffffffed5,
                                                     in_stack_fffffffffffffed4))),
                          in_stack_fffffffffffffed0);
              local_40.super_QFlagsStorage<QDir::Filter>.i =
                   (QFlagsStorage<QDir::Filter>)
                   QFlags<QDir::Filter>::operator&
                             ((QFlags<QDir::Filter> *)
                              CONCAT17(in_stack_fffffffffffffed7,
                                       CONCAT16(in_stack_fffffffffffffed6,
                                                CONCAT15(in_stack_fffffffffffffed5,
                                                         CONCAT14(in_stack_fffffffffffffed4,
                                                                  in_stack_fffffffffffffed0)))),
                              (QFlagsStorageHelper<QDir::Filter,_4>)
                              SUB84(in_stack_fffffffffffffed8,0));
              lhs.i = (Int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
              bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_40);
              if ((((bVar1 ^ 0xffU) & 1) == 0) ||
                 (bVar1 = QDirEntryInfo::isDir
                                    ((QDirEntryInfo *)
                                     CONCAT17(in_stack_fffffffffffffed7,
                                              CONCAT16(in_stack_fffffffffffffed6,
                                                       CONCAT15(in_stack_fffffffffffffed5,
                                                                CONCAT14(in_stack_fffffffffffffed4,
                                                                         in_stack_fffffffffffffed0))
                                                      ))), !bVar1)) {
                local_44.super_QFlagsStorage<QDir::Filter>.i =
                     (QFlagsStorage<QDir::Filter>)
                     QFlags<QDir::Filter>::operator&
                               ((QFlags<QDir::Filter> *)
                                CONCAT17(in_stack_fffffffffffffed7,
                                         CONCAT16(in_stack_fffffffffffffed6,
                                                  CONCAT15(in_stack_fffffffffffffed5,
                                                           CONCAT14(in_stack_fffffffffffffed4,
                                                                    in_stack_fffffffffffffed0)))),
                                in_stack_fffffffffffffecc);
                bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_44);
                if ((((bVar1 ^ 0xffU) & 1) == 0) ||
                   (bVar1 = QDirEntryInfo::isFile
                                      ((QDirEntryInfo *)
                                       CONCAT17(in_stack_fffffffffffffed7,
                                                CONCAT16(in_stack_fffffffffffffed6,
                                                         CONCAT15(in_stack_fffffffffffffed5,
                                                                  CONCAT14(in_stack_fffffffffffffed4
                                                                           ,
                                                  in_stack_fffffffffffffed0))))), !bVar1)) {
                  local_48 = 0xaaaaaaaa;
                  local_4c.super_QFlagsStorage<QDir::Filter>.i =
                       (QFlagsStorage<QDir::Filter>)
                       QFlags<QDir::Filter>::operator&
                                 ((QFlags<QDir::Filter> *)
                                  CONCAT17(in_stack_fffffffffffffed7,
                                           CONCAT16(in_stack_fffffffffffffed6,
                                                    CONCAT15(in_stack_fffffffffffffed5,
                                                             CONCAT14(in_stack_fffffffffffffed4,
                                                                      in_stack_fffffffffffffed0)))),
                                  in_stack_fffffffffffffecc);
                  local_48 = (Int)local_4c.super_QFlagsStorage<QDir::Filter>.i;
                  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_4d,0);
                  bVar1 = ::operator!=(local_4c.super_QFlagsStorage<QDir::Filter>.i);
                  bVar2 = false;
                  if (bVar1) {
                    bVar2 = ::operator!=((QFlags<QDir::Filter>)lhs.i,in_stack_fffffffffffffed0);
                  }
                  if (bVar2 != false) {
                    pQVar5 = this_00;
                    QFlags<QDir::Filter>::QFlags
                              ((QFlags<QDir::Filter> *)
                               CONCAT17(in_stack_fffffffffffffed7,
                                        CONCAT16(in_stack_fffffffffffffed6,
                                                 CONCAT15(in_stack_fffffffffffffed5,
                                                          CONCAT14(in_stack_fffffffffffffed4,
                                                                   in_stack_fffffffffffffed0)))),
                               in_stack_fffffffffffffecc);
                    bVar1 = QFlags<QDir::Filter>::testAnyFlags(pQVar5,local_58);
                    pQVar5 = this_00;
                    QFlags<QDir::Filter>::QFlags
                              ((QFlags<QDir::Filter> *)
                               CONCAT17(in_stack_fffffffffffffed7,
                                        CONCAT16(in_stack_fffffffffffffed6,
                                                 CONCAT15(in_stack_fffffffffffffed5,
                                                          CONCAT14(in_stack_fffffffffffffed4,
                                                                   in_stack_fffffffffffffed0)))),
                               in_stack_fffffffffffffecc);
                    bVar2 = QFlags<QDir::Filter>::testAnyFlags(pQVar5,local_5c);
                    QFlags<QDir::Filter>::QFlags
                              ((QFlags<QDir::Filter> *)
                               CONCAT17(in_stack_fffffffffffffed7,
                                        CONCAT16(in_stack_fffffffffffffed6,
                                                 CONCAT15(in_stack_fffffffffffffed5,
                                                          CONCAT14(in_stack_fffffffffffffed4,
                                                                   in_stack_fffffffffffffed0)))),
                               in_stack_fffffffffffffecc);
                    bVar3 = QFlags<QDir::Filter>::testAnyFlags(this_00,local_60);
                    if ((((bVar3) &&
                         (in_stack_fffffffffffffed7 =
                               QDirEntryInfo::isReadable
                                         ((QDirEntryInfo *)
                                          CONCAT17(in_stack_fffffffffffffed7,
                                                   CONCAT16(in_stack_fffffffffffffed6,
                                                            CONCAT15(in_stack_fffffffffffffed5,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffed4,
                                                  in_stack_fffffffffffffed0))))),
                         !(bool)in_stack_fffffffffffffed7)) ||
                        ((bVar1 && (in_stack_fffffffffffffed6 =
                                         QDirEntryInfo::isWritable
                                                   ((QDirEntryInfo *)
                                                    CONCAT17(in_stack_fffffffffffffed7,
                                                             CONCAT16(in_stack_fffffffffffffed6,
                                                                      CONCAT15(
                                                  in_stack_fffffffffffffed5,
                                                  CONCAT14(in_stack_fffffffffffffed4,
                                                           in_stack_fffffffffffffed0))))),
                                   !(bool)in_stack_fffffffffffffed6)))) ||
                       ((bVar2 && (bVar1 = QDirEntryInfo::isExecutable
                                                     ((QDirEntryInfo *)
                                                      CONCAT17(in_stack_fffffffffffffed7,
                                                               CONCAT16(in_stack_fffffffffffffed6,
                                                                        CONCAT15(
                                                  in_stack_fffffffffffffed5,
                                                  CONCAT14(in_stack_fffffffffffffed4,
                                                           in_stack_fffffffffffffed0))))), !bVar1)))
                       ) {
                      local_61 = false;
                      goto LAB_00294bee;
                    }
                  }
                  local_61 = true;
                }
                else {
                  local_61 = false;
                }
              }
              else {
                local_61 = false;
              }
            }
            else {
              local_61 = false;
            }
          }
          else {
            local_61 = false;
          }
        }
        else {
          local_61 = false;
        }
      }
    }
  }
LAB_00294bee:
  QString::~QString((QString *)0x294bfb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool QDirListingPrivate::matchesLegacyFilters(QDirEntryInfo &entryInfo) const
{
    Q_ASSERT(useLegacyFilters);

    const QString &fileName = entryInfo.fileName();
    if (fileName.isEmpty())
        return false;

    auto &filters = legacyDirFilters;

    // filter . and ..?
    const bool dotOrDotDot = isDotOrDotDot(fileName);
    const qsizetype fileNameSize = fileName.size();
    if ((filters & QDir::NoDot) && dotOrDotDot && fileNameSize == 1)
        return false;
    if ((filters & QDir::NoDotDot) && dotOrDotDot && fileNameSize == 2)
        return false;

    // name filter
#if QT_CONFIG(regularexpression)
    // Pass all entries through name filters, except dirs if AllDirs is set
    if (!(filters.testAnyFlags(QDir::AllDirs) && entryInfo.isDir())) {
        if (!regexMatchesName(fileName))
            return false;
    }
#endif
    // skip symlinks
    const bool skipSymlinks = filters.testAnyFlag(QDir::NoSymLinks);
    const bool includeSystem = filters.testAnyFlag(QDir::System);
    if (skipSymlinks && entryInfo.isSymLink()) {
        // The only reason to save this file is if it is a broken link and we are requesting system files.
        if (!includeSystem || entryInfo.exists())
            return false;
    }

    // filter hidden
    const bool includeHidden = filters.testAnyFlag(QDir::Hidden);
    if (!includeHidden && !dotOrDotDot && entryInfo.isHidden())
        return false;

    // filter system files
    if (!includeSystem) {
        if (!entryInfo.isFile() && !entryInfo.isDir() && !entryInfo.isSymLink())
            return false;
        if (entryInfo.isSymLink() && !entryInfo.exists())
            return false;
    }

    // skip directories
    const bool skipDirs = !(filters & (QDir::Dirs | QDir::AllDirs));
    if (skipDirs && entryInfo.isDir())
        return false;

    // skip files
    const bool skipFiles    = !(filters & QDir::Files);
    if (skipFiles && entryInfo.isFile())
        // Basically we need a reason not to exclude this file otherwise we just eliminate it.
        return false;

    // filter permissions
    const auto perms = filters & QDir::PermissionMask;
    const bool filterPermissions = perms != 0 && perms != QDir::PermissionMask;
    if (filterPermissions) {
        const bool doWritable = filters.testAnyFlags(QDir::Writable);
        const bool doExecutable = filters.testAnyFlags(QDir::Executable);
        const bool doReadable = filters.testAnyFlags(QDir::Readable);
        if ((doReadable && !entryInfo.isReadable())
            || (doWritable && !entryInfo.isWritable())
            || (doExecutable && !entryInfo.isExecutable())) {
            return false;
        }
    }

    return true;
}